

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

Vec_Int_t * Vec_IntStartRange(int First,int Range)

{
  undefined1 auVar1 [16];
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  long lVar8;
  
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < Range - 1U) {
    iVar2 = Range;
  }
  pVVar3->nCap = iVar2;
  if (iVar2 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar2 << 2);
  }
  pVVar3->pArray = piVar4;
  pVVar3->nSize = Range;
  auVar1 = _DAT_0093d220;
  if (0 < Range) {
    lVar5 = (ulong)(uint)Range - 1;
    auVar6._8_4_ = (int)lVar5;
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = 0;
    auVar6 = auVar6 ^ _DAT_0093d220;
    auVar7 = _DAT_0093d210;
    do {
      auVar9 = auVar7 ^ auVar1;
      if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                  auVar6._4_4_ < auVar9._4_4_) & 1)) {
        *(int *)((long)piVar4 + lVar5) = First;
      }
      if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
          auVar9._12_4_ <= auVar6._12_4_) {
        *(int *)((long)piVar4 + lVar5 + 4) = First + 1;
      }
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar8 + 2;
      lVar5 = lVar5 + 8;
      First = First + 2;
    } while ((ulong)(Range + 1U >> 1) << 3 != lVar5);
  }
  return pVVar3;
}

Assistant:

static inline Vec_Int_t * Vec_IntStartRange( int First, int Range )
{
    Vec_Int_t * p;
    int i;
    p = Vec_IntAlloc( Range );
    p->nSize = Range;
    for ( i = 0; i < Range; i++ )
        p->pArray[i] = First + i;
    return p;
}